

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.h
# Opt level: O2

void __thiscall BindingEnv::BindingEnv(BindingEnv *this)

{
  _Rb_tree_header *p_Var1;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_52);
  RelPathEnv::RelPathEnv(&this->super_RelPathEnv,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_RelPathEnv).super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001c1cf0;
  p_Var1 = &(this->bindings_)._M_t._M_impl.super__Rb_tree_header;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->rules_)._M_t._M_impl.super__Rb_tree_header;
  (this->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->rules_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->parent_ = (BindingEnv *)0x0;
  return;
}

Assistant:

BindingEnv() : RelPathEnv("", ""), parent_(NULL) {}